

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

void prepare_for_learner(vw *all,v_array<example_*> *examples)

{
  example *ae;
  substring example;
  char empty;
  char local_21;
  example *local_20;
  
  if (8 < (ulong)((long)examples->_end - (long)examples->_begin)) {
    ae = VW::get_unused_example(all);
    local_21 = '\0';
    example.end = &local_21;
    example.begin = &local_21;
    substring_to_example(all,ae,example);
    local_20 = ae;
    v_array<example_*>::push_back(examples,&local_20);
  }
  return;
}

Assistant:

inline size_t size() const { return _end - _begin; }